

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall jsonnet::internal::FixParens::visit(FixParens *this,Parens *expr)

{
  CompilerPass *this_00;
  long in_RSI;
  Fodder *in_RDI;
  Parens *body;
  Parens *in_stack_ffffffffffffffc8;
  Fodder *a;
  
  a = *(Fodder **)(in_RSI + 0x80);
  if (a == (Fodder *)0x0) {
    this_00 = (CompilerPass *)0x0;
  }
  else {
    this_00 = (CompilerPass *)__dynamic_cast(a,&AST::typeinfo,&Parens::typeinfo,0);
  }
  if (this_00 != (CompilerPass *)0x0) {
    *(_func_int ***)(in_RSI + 0x80) = this_00[8]._vptr_CompilerPass;
    internal::open_fodder((AST *)0x374436);
    fodder_move_front(a,in_RDI);
    fodder_move_front(a,in_RDI);
  }
  CompilerPass::visit(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void visit(Parens *expr)
    {
        if (auto *body = dynamic_cast<Parens *>(expr->expr)) {
            // Deal with fodder.
            expr->expr = body->expr;
            fodder_move_front(open_fodder(body->expr), body->openFodder);
            fodder_move_front(expr->closeFodder, body->closeFodder);
        }
        FmtPass::visit(expr);
    }